

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O0

FileDescriptor * __thiscall
SSD1306::FileDescriptor::operator=(FileDescriptor *this,FileDescriptor *rhs)

{
  int *in_RSI;
  FileDescriptor *in_RDI;
  function<bool_(int)> *unaff_retaddr;
  FileDescriptor *__f;
  
  in_RDI->fd_ = *in_RSI;
  __f = in_RDI;
  std::function<bool_(int)>::operator=(unaff_retaddr,(function<bool_(int)> *)in_RDI);
  *in_RSI = -1;
  std::function<bool(int)>::operator=(unaff_retaddr,(anon_class_1_0_00000001 *)__f);
  return in_RDI;
}

Assistant:

SSD1306::FileDescriptor&
SSD1306::FileDescriptor::operator= (
    SSD1306::FileDescriptor&& rhs)
{
    fd_ = rhs.fd_;
    close_if_ = std::move(rhs.close_if_);

    rhs.fd_ = -1;
    rhs.close_if_ = [](int) { return false; };

    return *this;
}